

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t _elemsize;
  _func_int *p_Var5;
  int *piVar6;
  _func_int **pp_Var7;
  Allocator *pAVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  undefined8 uVar13;
  undefined8 uVar20;
  undefined8 uVar27;
  Mat *pMVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar38;
  ulong uVar39;
  int iVar40;
  ulong uVar41;
  void *pvVar42;
  undefined4 *puVar43;
  uint uVar44;
  ulong uVar45;
  undefined4 *puVar46;
  int iVar47;
  int iVar48;
  ulong uVar49;
  long lVar50;
  undefined4 *puVar51;
  long lVar52;
  uint uVar53;
  int iVar54;
  int iVar55;
  ulong uVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  Mat bottom_blob_bordered;
  Mat inner_bottom_blob;
  Mat inner_top_blob;
  ulong local_130;
  long local_128;
  long local_120;
  long local_f8;
  long local_f0;
  Option opt_g;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined3 uVar16;
  undefined1 uVar17;
  undefined2 uVar18;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined3 uVar23;
  undefined1 uVar24;
  undefined2 uVar25;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined3 uVar30;
  undefined1 uVar31;
  undefined2 uVar32;
  undefined1 uVar33;
  
  iVar1 = bottom_blob->w;
  iVar54 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var5 = this->_vptr_Convolution_x86[-3];
  iVar2 = *(int *)(p_Var5 + 0x2c + (long)&(this->weight_sgemm_data).data);
  uVar3 = *(uint *)(p_Var5 + 0x34 + (long)&(this->weight_sgemm_data).data);
  uVar49 = (ulong)uVar3;
  iVar4 = *(int *)(p_Var5 + 0x3c + (long)&(this->weight_sgemm_data).data);
  bottom_blob_bordered.data = bottom_blob->data;
  piVar6 = bottom_blob->refcount;
  bottom_blob_bordered.refcount._0_4_ = SUB84(piVar6,0);
  bottom_blob_bordered.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  bottom_blob_bordered.elempack = bottom_blob->elempack;
  bottom_blob_bordered.allocator = bottom_blob->allocator;
  bottom_blob_bordered.dims = bottom_blob->dims;
  bottom_blob_bordered.w = bottom_blob->w;
  bottom_blob_bordered.h = bottom_blob->h;
  bottom_blob_bordered.c = bottom_blob->c;
  bottom_blob_bordered.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  iVar55 = (iVar2 + -1) * uVar3;
  pp_Var7 = this->_vptr_Convolution_x86;
  p_Var5 = pp_Var7[-3];
  iVar37 = *(int *)(p_Var5 + 4 +
                   (long)&(this->weight_3x3_winograd43_data).
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>);
  bottom_blob_bordered.elemsize = _elemsize;
  if ((((iVar37 < 1) &&
       (iVar48 = *(int *)(p_Var5 + 8 +
                         (long)&(this->weight_3x3_winograd43_data).
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
       iVar48 < 1)) &&
      (iVar47 = *(int *)(p_Var5 + 0xc +
                        (long)&(this->weight_3x3_winograd43_data).
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
      iVar47 < 1)) &&
     (iVar35 = *(int *)(p_Var5 + 0x10 +
                       (long)&(this->weight_3x3_winograd43_data).
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>), iVar35 < 1
     )) {
    if (((iVar37 == -0xe9) && (iVar48 == -0xe9)) && ((iVar47 == -0xe9 && (iVar35 == -0xe9)))) {
      iVar48 = iVar55 - (iVar1 + -1) % iVar4;
      iVar37 = iVar55 - (iVar54 + -1) % iVar4;
      if ((iVar48 < 1) && (iVar37 < 1)) {
LAB_00129f7b:
        bVar57 = true;
        iVar54 = bottom_blob_bordered.h;
        iVar1 = bottom_blob_bordered.w;
      }
      else {
        inner_bottom_blob.allocator = *(Allocator **)&opt->use_int8_arithmetic;
        inner_bottom_blob.data = *(void **)opt;
        inner_bottom_blob.elemsize = (size_t)opt->workspace_allocator;
        uVar20._0_1_ = opt->use_winograd_convolution;
        uVar20._1_1_ = opt->use_sgemm_convolution;
        uVar20._2_1_ = opt->use_int8_inference;
        uVar20._3_1_ = opt->use_vulkan_compute;
        uVar21 = opt->use_fp16_packed;
        uVar22 = opt->use_fp16_storage;
        uVar24 = opt->use_fp16_arithmetic;
        uVar26 = opt->use_int8_storage;
        uVar25 = CONCAT11(uVar26,uVar24);
        uVar23 = CONCAT21(uVar25,uVar22);
        uVar20._4_4_ = CONCAT31(uVar23,uVar21);
        inner_bottom_blob.elempack = (int)uVar20;
        inner_bottom_blob.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
        inner_bottom_blob.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        inner_bottom_blob._28_4_ = uVar20._4_4_;
        copy_make_border(bottom_blob,&bottom_blob_bordered,iVar37 / 2,iVar37 - iVar37 / 2,iVar48 / 2
                         ,iVar48 - iVar48 / 2,0,
                         *(float *)(pp_Var7[-3] + 0x14 +
                                   (long)&(this->weight_3x3_winograd43_data).
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                         ,(Option *)&inner_bottom_blob);
LAB_00129f63:
        if ((bottom_blob_bordered.data != (void *)0x0) &&
           ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) goto LAB_00129f7b;
        bVar57 = false;
      }
      iVar37 = -100;
      if (!bVar57) goto LAB_00129f9d;
    }
    else if (((iVar37 == -0xea) && (iVar48 == -0xea)) && ((iVar47 == -0xea && (iVar35 == -0xea)))) {
      iVar48 = iVar55 - (iVar1 + -1) % iVar4;
      iVar37 = iVar55 - (iVar54 + -1) % iVar4;
      if ((0 < iVar48) || (0 < iVar37)) {
        inner_bottom_blob.allocator = *(Allocator **)&opt->use_int8_arithmetic;
        inner_bottom_blob.data = *(void **)opt;
        inner_bottom_blob.elemsize = (size_t)opt->workspace_allocator;
        uVar27._0_1_ = opt->use_winograd_convolution;
        uVar27._1_1_ = opt->use_sgemm_convolution;
        uVar27._2_1_ = opt->use_int8_inference;
        uVar27._3_1_ = opt->use_vulkan_compute;
        uVar28 = opt->use_fp16_packed;
        uVar29 = opt->use_fp16_storage;
        uVar31 = opt->use_fp16_arithmetic;
        uVar33 = opt->use_int8_storage;
        uVar32 = CONCAT11(uVar33,uVar31);
        uVar30 = CONCAT21(uVar32,uVar29);
        uVar27._4_4_ = CONCAT31(uVar30,uVar28);
        inner_bottom_blob.elempack = (int)uVar27;
        inner_bottom_blob.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
        inner_bottom_blob.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        inner_bottom_blob._28_4_ = uVar27._4_4_;
        copy_make_border(bottom_blob,&bottom_blob_bordered,iVar37 - iVar37 / 2,iVar37 / 2,
                         iVar48 - iVar48 / 2,iVar48 / 2,0,
                         *(float *)(pp_Var7[-3] + 0x14 +
                                   (long)&(this->weight_3x3_winograd43_data).
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                         ,(Option *)&inner_bottom_blob);
        goto LAB_00129f63;
      }
      goto LAB_00129f7b;
    }
  }
  else {
    inner_bottom_blob.allocator = *(Allocator **)&opt->use_int8_arithmetic;
    inner_bottom_blob.data = *(void **)opt;
    inner_bottom_blob.elemsize = (size_t)opt->workspace_allocator;
    uVar13._0_1_ = opt->use_winograd_convolution;
    uVar13._1_1_ = opt->use_sgemm_convolution;
    uVar13._2_1_ = opt->use_int8_inference;
    uVar13._3_1_ = opt->use_vulkan_compute;
    uVar14 = opt->use_fp16_packed;
    uVar15 = opt->use_fp16_storage;
    uVar17 = opt->use_fp16_arithmetic;
    uVar19 = opt->use_int8_storage;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar13._4_4_ = CONCAT31(uVar16,uVar14);
    inner_bottom_blob.elempack = (int)uVar13;
    inner_bottom_blob.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    inner_bottom_blob.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    p_Var5 = pp_Var7[-3];
    inner_bottom_blob._28_4_ = uVar13._4_4_;
    copy_make_border(bottom_blob,&bottom_blob_bordered,
                     *(int *)(p_Var5 + 0xc +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var5 + 0x10 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var5 + 4 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var5 + 8 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),0,
                     *(float *)(p_Var5 + 0x14 +
                               (long)&(this->weight_3x3_winograd43_data).
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     (Option *)&inner_bottom_blob);
    if (bottom_blob_bordered.data == (void *)0x0) {
      bVar57 = true;
    }
    else {
      bVar57 = (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0;
    }
    if (!bVar57) {
      iVar54 = bottom_blob_bordered.h;
      iVar1 = bottom_blob_bordered.w;
    }
    iVar37 = -100;
    inner_bottom_blob.refcount =
         (int *)CONCAT44(inner_bottom_blob.refcount._4_4_,inner_bottom_blob.refcount._0_4_);
    inner_top_blob.refcount =
         (int *)CONCAT44(inner_top_blob.refcount._4_4_,inner_top_blob.refcount._0_4_);
    if (bVar57) goto LAB_00129f9d;
  }
  iVar48 = (iVar1 - (iVar55 + 1)) / iVar4;
  iVar47 = iVar48 + 1;
  Mat::create(top_blob,iVar47,(iVar54 - (iVar55 + 1)) / iVar4 + 1,
              *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                      (long)&(this->weight_sgemm_data).data),_elemsize,opt->blob_allocator);
  iVar37 = -100;
  inner_bottom_blob.refcount =
       (int *)CONCAT44(inner_bottom_blob.refcount._4_4_,inner_bottom_blob.refcount._0_4_);
  inner_top_blob.refcount =
       (int *)CONCAT44(inner_top_blob.refcount._4_4_,inner_top_blob.refcount._0_4_);
  if ((top_blob->data != (void *)0x0) &&
     (inner_bottom_blob.refcount =
           (int *)CONCAT44(inner_bottom_blob.refcount._4_4_,inner_bottom_blob.refcount._0_4_),
     inner_top_blob.refcount =
          (int *)CONCAT44(inner_top_blob.refcount._4_4_,inner_top_blob.refcount._0_4_),
     (long)top_blob->c * top_blob->cstep != 0)) {
    inner_bottom_blob.elemsize = 0;
    inner_bottom_blob.elempack = 0;
    inner_bottom_blob.data = (void *)0x0;
    inner_bottom_blob.refcount = (int *)0x0;
    inner_bottom_blob.allocator = (Allocator *)0x0;
    inner_bottom_blob.dims = 0;
    inner_bottom_blob.w = 0;
    inner_bottom_blob.h = 0;
    inner_bottom_blob.c = 0;
    inner_bottom_blob.cstep = 0;
    inner_top_blob.elemsize = 0;
    inner_top_blob.elempack = 0;
    inner_top_blob.data = (void *)0x0;
    inner_top_blob.refcount = (int *)0x0;
    inner_top_blob.allocator = (Allocator *)0x0;
    inner_top_blob.dims = 0;
    inner_top_blob.w = 0;
    inner_top_blob.h = 0;
    inner_top_blob.c = 0;
    inner_top_blob.cstep = 0;
    if ((int)uVar3 < 1) {
      iVar37 = 0;
    }
    else {
      local_120 = 0;
      local_128 = 0;
      local_130 = 0;
      inner_bottom_blob.refcount = (int *)0x0;
      inner_top_blob.refcount = (int *)0x0;
      do {
        uVar11 = (long)(int)(((uVar3 - 1) + iVar54) - (int)local_130) / (long)(int)uVar3;
        iVar35 = (int)uVar11;
        iVar55 = (iVar35 - iVar2) / iVar4;
        uVar53 = iVar55 + 1;
        local_f8 = local_120;
        local_f0 = local_128;
        uVar45 = 0;
        do {
          uVar39 = (long)(int)(((uVar3 - 1) + iVar1) - (int)uVar45) / (long)(int)uVar3;
          iVar36 = (int)uVar39;
          iVar12 = (iVar36 - iVar2) / iVar4;
          iVar37 = bottom_blob->c;
          pAVar8 = opt->workspace_allocator;
          auVar59._0_4_ = -(uint)(inner_bottom_blob.dims == 3);
          auVar59._4_4_ = -(uint)(iVar36 == inner_bottom_blob.w);
          auVar59._8_4_ = -(uint)(iVar35 == inner_bottom_blob.h);
          auVar59._12_4_ = -(uint)(iVar37 == inner_bottom_blob.c);
          iVar40 = movmskps(uVar3,auVar59);
          if ((((iVar40 != 0xf) || (inner_bottom_blob.elempack != 1)) ||
              (inner_bottom_blob.allocator != pAVar8)) || (inner_bottom_blob.elemsize != _elemsize))
          {
            if (inner_bottom_blob.refcount != (int *)0x0) {
              LOCK();
              *inner_bottom_blob.refcount = *inner_bottom_blob.refcount + -1;
              UNLOCK();
              if (*inner_bottom_blob.refcount == 0) {
                if (inner_bottom_blob.allocator == (Allocator *)0x0) {
                  if (inner_bottom_blob.data != (void *)0x0) {
                    free(inner_bottom_blob.data);
                  }
                }
                else {
                  (*(inner_bottom_blob.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            inner_bottom_blob.data = (void *)0x0;
            inner_bottom_blob.refcount._0_4_ = 0;
            inner_bottom_blob.refcount._4_4_ = 0;
            inner_bottom_blob.refcount = (int *)0x0;
            inner_bottom_blob.elempack = 1;
            inner_bottom_blob.dims = 3;
            inner_bottom_blob.cstep =
                 ((long)(iVar35 * iVar36) * _elemsize + 0xf & 0xfffffffffffffff0) / _elemsize;
            inner_bottom_blob.elemsize = _elemsize;
            inner_bottom_blob.allocator = pAVar8;
            inner_bottom_blob.w = iVar36;
            inner_bottom_blob.h = iVar35;
            inner_bottom_blob.c = iVar37;
            if ((long)iVar37 * inner_bottom_blob.cstep != 0) {
              uVar41 = (long)iVar37 * inner_bottom_blob.cstep * _elemsize + 3 & 0xfffffffffffffffc;
              if (pAVar8 == (Allocator *)0x0) {
                opt_g.lightmode = false;
                opt_g._1_3_ = 0;
                opt_g.num_threads = 0;
                iVar37 = posix_memalign((void **)&opt_g,0x10,uVar41 + 4);
                inner_bottom_blob.data = (void *)opt_g._0_8_;
                if (iVar37 != 0) {
                  opt_g.lightmode = false;
                  opt_g._1_3_ = 0;
                  opt_g.num_threads = 0;
                  inner_bottom_blob.data = (void *)opt_g._0_8_;
                }
              }
              else {
                iVar37 = (*pAVar8->_vptr_Allocator[2])(pAVar8,uVar41 + 4);
                inner_bottom_blob.data = (void *)CONCAT44(extraout_var,iVar37);
              }
              inner_bottom_blob.refcount = (int *)((long)inner_bottom_blob.data + uVar41);
              *(undefined4 *)((long)inner_bottom_blob.data + uVar41) = 1;
            }
          }
          iVar37 = -100;
          if ((inner_bottom_blob.data == (void *)0x0) ||
             ((long)inner_bottom_blob.c * inner_bottom_blob.cstep == 0)) goto LAB_00129d1d;
          uVar44 = iVar12 + 1;
          iVar37 = *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                           (long)&(this->weight_sgemm_data).data);
          pAVar8 = opt->workspace_allocator;
          auVar58._0_4_ = -(uint)(inner_top_blob.dims == 3);
          auVar58._4_4_ = -(uint)(uVar44 == inner_top_blob.w);
          auVar58._8_4_ = -(uint)(uVar53 == inner_top_blob.h);
          auVar58._12_4_ = -(uint)(iVar37 == inner_top_blob.c);
          iVar40 = movmskps((int)this,auVar58);
          if (((iVar40 != 0xf) ||
              ((inner_top_blob.elempack != 1 || (inner_top_blob.allocator != pAVar8)))) ||
             (inner_top_blob.elemsize != _elemsize)) {
            if (inner_top_blob.refcount != (int *)0x0) {
              LOCK();
              *inner_top_blob.refcount = *inner_top_blob.refcount + -1;
              UNLOCK();
              if (*inner_top_blob.refcount == 0) {
                if (inner_top_blob.allocator == (Allocator *)0x0) {
                  if (inner_top_blob.data != (void *)0x0) {
                    free(inner_top_blob.data);
                  }
                }
                else {
                  (*(inner_top_blob.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            inner_top_blob.data = (void *)0x0;
            inner_top_blob.refcount._0_4_ = 0;
            inner_top_blob.refcount._4_4_ = 0;
            inner_top_blob.refcount = (int *)0x0;
            inner_top_blob.elempack = 1;
            inner_top_blob.dims = 3;
            inner_top_blob.cstep =
                 ((long)(int)(uVar53 * uVar44) * _elemsize + 0xf & 0xfffffffffffffff0) / _elemsize;
            inner_top_blob.elemsize = _elemsize;
            inner_top_blob.allocator = pAVar8;
            inner_top_blob.w = uVar44;
            inner_top_blob.h = uVar53;
            inner_top_blob.c = iVar37;
            if ((long)iVar37 * inner_top_blob.cstep != 0) {
              uVar41 = (long)iVar37 * inner_top_blob.cstep * _elemsize + 3 & 0xfffffffffffffffc;
              if (pAVar8 == (Allocator *)0x0) {
                opt_g.lightmode = false;
                opt_g._1_3_ = 0;
                opt_g.num_threads = 0;
                iVar37 = posix_memalign((void **)&opt_g,0x10,uVar41 + 4);
                inner_top_blob.data = (void *)opt_g._0_8_;
                if (iVar37 != 0) {
                  opt_g.lightmode = false;
                  opt_g._1_3_ = 0;
                  opt_g.num_threads = 0;
                  inner_top_blob.data = (void *)opt_g._0_8_;
                }
              }
              else {
                iVar37 = (*pAVar8->_vptr_Allocator[2])(pAVar8,uVar41 + 4);
                inner_top_blob.data = (void *)CONCAT44(extraout_var_00,iVar37);
              }
              inner_top_blob.refcount = (int *)((long)inner_top_blob.data + uVar41);
              *(undefined4 *)((long)inner_top_blob.data + uVar41) = 1;
            }
          }
          iVar37 = -100;
          if ((inner_top_blob.data == (void *)0x0) ||
             ((long)inner_top_blob.c * inner_top_blob.cstep == 0)) goto LAB_00129d1d;
          iVar37 = bottom_blob->c;
          if (0 < (long)iVar37) {
            lVar50 = (long)bottom_blob_bordered.data + local_f0;
            lVar52 = 0;
            pvVar38 = inner_bottom_blob.data;
            do {
              if (0 < iVar35) {
                iVar40 = 0;
                uVar41 = 0;
                pvVar42 = pvVar38;
                do {
                  if (0 < iVar36) {
                    puVar43 = (undefined4 *)(lVar50 + (long)iVar40 * 4);
                    uVar56 = 0;
                    do {
                      *(undefined4 *)((long)pvVar42 + uVar56 * 4) = *puVar43;
                      uVar56 = uVar56 + 1;
                      puVar43 = puVar43 + uVar49;
                    } while ((uVar39 & 0xffffffff) != uVar56);
                  }
                  uVar41 = uVar41 + 1;
                  iVar40 = iVar40 + iVar1 * uVar3;
                  pvVar42 = (void *)((long)pvVar42 + (long)iVar36 * 4);
                } while (uVar41 != (uVar11 & 0xffffffff));
              }
              lVar52 = lVar52 + 1;
              lVar50 = lVar50 + bottom_blob_bordered.cstep * bottom_blob_bordered.elemsize;
              pvVar38 = (void *)((long)pvVar38 +
                                inner_bottom_blob.cstep * inner_bottom_blob.elemsize);
            } while (lVar52 != iVar37);
          }
          opt_g.lightmode = opt->lightmode;
          opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
          opt_g.num_threads = opt->num_threads;
          opt_g.workspace_allocator = opt->workspace_allocator;
          opt_g.use_winograd_convolution = opt->use_winograd_convolution;
          opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
          opt_g.use_int8_inference = opt->use_int8_inference;
          opt_g.use_vulkan_compute = opt->use_vulkan_compute;
          opt_g.use_fp16_packed = opt->use_fp16_packed;
          opt_g.use_fp16_storage = opt->use_fp16_storage;
          opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          opt_g.use_int8_storage = opt->use_int8_storage;
          opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
          opt_g.use_packing_layout = opt->use_packing_layout;
          opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
          opt_g.blob_allocator = inner_top_blob.allocator;
          pMVar34 = (Mat *)(&this->field_0x100 + (long)this->_vptr_Convolution_x86[-3]);
          if (iVar2 == 7) {
            pMVar34 = &this->weight_sgemm_data;
          }
          (*conv)(&inner_bottom_blob,&inner_top_blob,pMVar34,
                  (Mat *)(&this->field_0x140 + (long)this->_vptr_Convolution_x86[-3]),&opt_g);
          pp_Var7 = this->_vptr_Convolution_x86;
          if (0 < *(int *)(pp_Var7[-3] + 0x28 + (long)&(this->weight_sgemm_data).data)) {
            sVar9 = top_blob->cstep;
            puVar43 = (undefined4 *)((long)top_blob->data + local_f8);
            sVar10 = top_blob->elemsize;
            lVar50 = 0;
            pvVar38 = inner_top_blob.data;
            do {
              if (-1 < iVar55) {
                uVar39 = 0;
                puVar51 = puVar43;
                pvVar42 = pvVar38;
                do {
                  if (-1 < iVar12) {
                    uVar41 = 0;
                    puVar46 = puVar51;
                    do {
                      *puVar46 = *(undefined4 *)((long)pvVar42 + uVar41 * 4);
                      uVar41 = uVar41 + 1;
                      puVar46 = puVar46 + uVar49;
                    } while (uVar44 != uVar41);
                  }
                  uVar39 = uVar39 + 1;
                  puVar51 = puVar51 + (int)(iVar47 * uVar3);
                  pvVar42 = (void *)((long)pvVar42 + (long)(int)uVar44 * 4);
                } while (uVar39 != uVar53);
              }
              lVar50 = lVar50 + 1;
              puVar43 = (undefined4 *)((long)puVar43 + sVar9 * sVar10);
              pvVar38 = (void *)((long)pvVar38 + inner_top_blob.cstep * inner_top_blob.elemsize);
            } while (lVar50 < *(int *)(pp_Var7[-3] + 0x28 + (long)&(this->weight_sgemm_data).data));
          }
          uVar45 = uVar45 + 1;
          local_f0 = local_f0 + 4;
          local_f8 = local_f8 + 4;
        } while (uVar45 != uVar49);
        local_130 = local_130 + 1;
        local_128 = local_128 + (long)iVar1 * 4;
        local_120 = local_120 + (long)iVar48 * 4 + 4;
        iVar37 = 0;
      } while (local_130 != uVar49);
    }
LAB_00129d1d:
    if (inner_top_blob.refcount != (int *)0x0) {
      LOCK();
      *inner_top_blob.refcount = *inner_top_blob.refcount + -1;
      UNLOCK();
      if (*inner_top_blob.refcount == 0) {
        if (inner_top_blob.allocator == (Allocator *)0x0) {
          if (inner_top_blob.data != (void *)0x0) {
            free(inner_top_blob.data);
          }
        }
        else {
          (*(inner_top_blob.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (inner_bottom_blob.refcount != (int *)0x0) {
      LOCK();
      *inner_bottom_blob.refcount = *inner_bottom_blob.refcount + -1;
      UNLOCK();
      if (*inner_bottom_blob.refcount == 0) {
        if (inner_bottom_blob.allocator == (Allocator *)0x0) {
          if (inner_bottom_blob.data != (void *)0x0) {
            free(inner_bottom_blob.data);
          }
        }
        else {
          (*(inner_bottom_blob.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
LAB_00129f9d:
  piVar6 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,bottom_blob_bordered.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (bottom_blob_bordered.allocator == (Allocator *)0x0) {
        if (bottom_blob_bordered.data != (void *)0x0) {
          free(bottom_blob_bordered.data);
        }
      }
      else {
        (*(bottom_blob_bordered.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar37;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            if (kernel_size == 7)
            {
            // FIXME conv7x7s1_sse use sgemm
            conv(inner_bottom_blob, inner_top_blob, weight_sgemm_data, bias_data, opt_g);
            }
            else
            {
            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data, opt_g);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}